

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::timeAndDate(Forth *this)

{
  tm *ptVar1;
  Cell local_40;
  Cell local_3c;
  Cell local_38;
  Cell local_34;
  Cell local_30;
  Cell local_2c;
  tm *tm;
  time_t t;
  Forth *this_local;
  
  t = (time_t)this;
  requireDStackAvailable(this,6,"TIME&DATE");
  tm = (tm *)time((time_t *)0x0);
  ptVar1 = localtime((time_t *)&tm);
  if (ptVar1 == (tm *)0x0) {
    local_2c = 0;
  }
  else {
    local_2c = ptVar1->tm_sec;
  }
  push(this,local_2c);
  if (ptVar1 == (tm *)0x0) {
    local_30 = 0;
  }
  else {
    local_30 = ptVar1->tm_min;
  }
  push(this,local_30);
  if (ptVar1 == (tm *)0x0) {
    local_34 = 0;
  }
  else {
    local_34 = ptVar1->tm_hour;
  }
  push(this,local_34);
  if (ptVar1 == (tm *)0x0) {
    local_38 = 1;
  }
  else {
    local_38 = ptVar1->tm_mday;
  }
  push(this,local_38);
  if (ptVar1 == (tm *)0x0) {
    local_3c = 1;
  }
  else {
    local_3c = ptVar1->tm_mon + 1;
  }
  push(this,local_3c);
  if (ptVar1 == (tm *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = ptVar1->tm_year + 0x76c;
  }
  push(this,local_40);
  return;
}

Assistant:

void timeAndDate() {
			REQUIRE_DSTACK_AVAILABLE(6, "TIME&DATE");
			auto t = std::time(0);
			tm *tm;
			tm=std::localtime( &t);
			
			push(static_cast<Cell>(tm?tm->tm_sec:0));
			push(static_cast<Cell>(tm ? tm->tm_min : 0));
			push(static_cast<Cell>(tm ? tm->tm_hour : 0));
			push(static_cast<Cell>(tm ? tm->tm_mday : 1));
			push(static_cast<Cell>(tm ? tm->tm_mon + 1 : 1));
			push(static_cast<Cell>(tm ? tm->tm_year + 1900 : 0));
		}